

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

int yaml_parser_fetch_block_scalar(yaml_parser_t *parser,int literal)

{
  size_t *psVar1;
  yaml_char_t **ppyVar2;
  yaml_token_t **tail;
  byte bVar3;
  yaml_char_t yVar4;
  yaml_char_t *pyVar5;
  yaml_mark_t start_mark_00;
  yaml_mark_t start_mark_01;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  undefined1 (*pauVar9) [16];
  byte *pbVar10;
  char *pcVar11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  size_t sVar15;
  long lVar16;
  yaml_token_t *pyVar17;
  yaml_token_t *pyVar18;
  bool bVar19;
  byte bVar20;
  undefined1 auVar21 [16];
  long lStackY_160;
  undefined1 local_138 [8];
  undefined1 (*pauStack_130) [16];
  undefined1 (*local_128 [2]) [16];
  undefined1 (*local_118) [16];
  undefined1 (*pauStack_110) [16];
  undefined1 (*pauStack_108) [16];
  int local_100;
  int local_fc;
  yaml_string_t local_f8;
  int local_d4;
  yaml_mark_t *local_d0;
  yaml_mark_t start_mark;
  yaml_mark_t end_mark;
  yaml_token_t token;
  
  bVar20 = 0;
  iVar7 = yaml_parser_remove_simple_key(parser);
  if (iVar7 == 0) {
    return 0;
  }
  parser->simple_key_allowed = 1;
  pauStack_110 = (undefined1 (*) [16])0x0;
  pauStack_108 = (undefined1 (*) [16])0x0;
  local_128[0] = (undefined1 (*) [16])0x0;
  _local_138 = (undefined1  [16])0x0;
  local_f8.pointer = (yaml_char_t *)0x0;
  local_f8.start = (yaml_char_t *)0x0;
  local_f8.end = (yaml_char_t *)0x0;
  local_fc = 0;
  local_118 = (undefined1 (*) [16])yaml_malloc(0x10);
  if (local_118 != (undefined1 (*) [16])0x0) {
    pauStack_110 = local_118 + 1;
    *local_118 = (undefined1  [16])0x0;
    pauStack_108 = local_118;
    pauVar9 = (undefined1 (*) [16])yaml_malloc(0x10);
    local_138 = (undefined1  [8])pauVar9;
    if (pauVar9 != (undefined1 (*) [16])0x0) {
      pauStack_130 = pauVar9 + 1;
      *pauVar9 = (undefined1  [16])0x0;
      local_128[0] = pauVar9;
      pauVar9 = (undefined1 (*) [16])yaml_malloc(0x10);
      local_f8.start = (yaml_char_t *)pauVar9;
      if (pauVar9 != (undefined1 (*) [16])0x0) {
        local_f8.end = (yaml_char_t *)(pauVar9 + 1);
        *pauVar9 = (undefined1  [16])0x0;
        start_mark.column = (parser->mark).column;
        start_mark.index = (parser->mark).index;
        start_mark.line = (parser->mark).line;
        (parser->mark).index = (parser->mark).index + 1;
        psVar1 = &(parser->mark).column;
        *psVar1 = *psVar1 + 1;
        pbVar10 = (parser->buffer).pointer;
        sVar15 = parser->unread - 1;
        parser->unread = sVar15;
        bVar12 = *pbVar10;
        if ((char)bVar12 < '\0') {
          if ((bVar12 & 0xe0) == 0xc0) {
            lStackY_160 = 2;
          }
          else if ((bVar12 & 0xf0) == 0xe0) {
            lStackY_160 = 3;
          }
          else {
            lStackY_160 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
          }
        }
        else {
          lStackY_160 = 1;
        }
        pbVar10 = pbVar10 + lStackY_160;
        (parser->buffer).pointer = pbVar10;
        local_f8.pointer = (yaml_char_t *)pauVar9;
        local_d4 = literal;
        if (sVar15 == 0) {
          iVar7 = yaml_parser_update_buffer(parser,1);
          if (iVar7 == 0) goto LAB_0010c407;
          pbVar10 = (parser->buffer).pointer;
        }
        local_d0 = &parser->mark;
        bVar12 = *pbVar10;
        if ((bVar12 == 0x2d) || (bVar12 == 0x2b)) {
          (parser->mark).index = (parser->mark).index + 1;
          psVar1 = &(parser->mark).column;
          *psVar1 = *psVar1 + 1;
          sVar15 = parser->unread - 1;
          parser->unread = sVar15;
          bVar3 = *pbVar10;
          if ((char)bVar3 < '\0') {
            if ((bVar3 & 0xe0) == 0xc0) {
              lStackY_160 = 2;
            }
            else if ((bVar3 & 0xf0) == 0xe0) {
              lStackY_160 = 3;
            }
            else {
              lStackY_160 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
            }
          }
          else {
            lStackY_160 = 1;
          }
          pbVar10 = pbVar10 + lStackY_160;
          (parser->buffer).pointer = pbVar10;
          if (sVar15 == 0) {
            iVar7 = yaml_parser_update_buffer(parser,1);
            if (iVar7 == 0) goto LAB_0010c407;
            pbVar10 = (parser->buffer).pointer;
          }
          iVar7 = (uint)(bVar12 == 0x2b) * 2 + -1;
          bVar12 = *pbVar10;
          iVar13 = 0;
          if ((byte)(bVar12 - 0x30) < 10) {
            if (bVar12 == 0x30) goto LAB_0010b869;
            (parser->mark).index = (parser->mark).index + 1;
            psVar1 = &(parser->mark).column;
            *psVar1 = *psVar1 + 1;
            parser->unread = parser->unread - 1;
            bVar3 = *pbVar10;
            if ((char)bVar3 < '\0') {
              if ((bVar3 & 0xe0) == 0xc0) {
                lStackY_160 = 2;
              }
              else if ((bVar3 & 0xf0) == 0xe0) {
                lStackY_160 = 3;
              }
              else {
                lStackY_160 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
              }
            }
            else {
              lStackY_160 = 1;
            }
            iVar13 = bVar12 - 0x30;
            pbVar10 = pbVar10 + lStackY_160;
LAB_0010ba00:
            (parser->buffer).pointer = pbVar10;
          }
        }
        else if ((byte)(bVar12 - 0x30) < 10) {
          if (bVar12 == 0x30) {
LAB_0010b869:
            parser->error = YAML_SCANNER_ERROR;
            parser->context = "while scanning a block scalar";
            (parser->context_mark).index = start_mark.index;
            (parser->context_mark).line = start_mark.line;
            (parser->context_mark).column = start_mark.column;
            pcVar11 = "found an indentation indicator equal to 0";
            goto LAB_0010bc32;
          }
          (parser->mark).index = (parser->mark).index + 1;
          psVar1 = &(parser->mark).column;
          *psVar1 = *psVar1 + 1;
          sVar15 = parser->unread - 1;
          parser->unread = sVar15;
          bVar3 = *pbVar10;
          if ((char)bVar3 < '\0') {
            if ((bVar3 & 0xe0) == 0xc0) {
              lStackY_160 = 2;
            }
            else if ((bVar3 & 0xf0) == 0xe0) {
              lStackY_160 = 3;
            }
            else {
              lStackY_160 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
            }
          }
          else {
            lStackY_160 = 1;
          }
          pbVar10 = pbVar10 + lStackY_160;
          (parser->buffer).pointer = pbVar10;
          if (sVar15 == 0) {
            iVar7 = yaml_parser_update_buffer(parser,1);
            if (iVar7 == 0) goto LAB_0010c407;
            pbVar10 = (parser->buffer).pointer;
          }
          iVar13 = bVar12 - 0x30;
          bVar12 = *pbVar10;
          if ((bVar12 == 0x2d) || (bVar12 == 0x2b)) {
            (parser->mark).index = (parser->mark).index + 1;
            psVar1 = &(parser->mark).column;
            *psVar1 = *psVar1 + 1;
            parser->unread = parser->unread - 1;
            bVar3 = *pbVar10;
            if ((char)bVar3 < '\0') {
              if ((bVar3 & 0xe0) == 0xc0) {
                lStackY_160 = 2;
              }
              else if ((bVar3 & 0xf0) == 0xe0) {
                lStackY_160 = 3;
              }
              else {
                lStackY_160 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
              }
            }
            else {
              lStackY_160 = 1;
            }
            iVar7 = (uint)(bVar12 == 0x2b) * 2 + -1;
            pbVar10 = pbVar10 + lStackY_160;
            goto LAB_0010ba00;
          }
          local_100 = 0;
          iVar7 = local_100;
        }
        else {
          local_100 = 0;
          iVar13 = 0;
          iVar7 = local_100;
        }
        local_100 = iVar7;
        if ((parser->unread != 0) || (iVar7 = yaml_parser_update_buffer(parser,1), iVar7 != 0)) {
          do {
            pbVar10 = (parser->buffer).pointer;
            bVar12 = *pbVar10;
            uVar14 = (uint)bVar12;
            if ((bVar12 != 9) && (bVar12 != 0x20)) {
              if (bVar12 != 0x23) goto LAB_0010bbb7;
              goto LAB_0010bae7;
            }
            (parser->mark).index = (parser->mark).index + 1;
            psVar1 = &(parser->mark).column;
            *psVar1 = *psVar1 + 1;
            sVar15 = parser->unread - 1;
            parser->unread = sVar15;
            bVar12 = *pbVar10;
            lVar16 = 1;
            if ((((char)bVar12 < '\0') && (lVar16 = 2, (bVar12 & 0xe0) != 0xc0)) &&
               (lVar16 = 3, (bVar12 & 0xf0) != 0xe0)) {
              lVar16 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
            }
            (parser->buffer).pointer = pbVar10 + lVar16;
          } while ((sVar15 != 0) || (iVar7 = yaml_parser_update_buffer(parser,1), iVar7 != 0));
        }
        goto LAB_0010c407;
      }
    }
  }
LAB_0010c401:
  parser->error = YAML_MEMORY_ERROR;
  goto LAB_0010c407;
LAB_0010bae7:
  if ((char)uVar14 == -0x3e) {
    if (pbVar10[1] == 0x85) {
      bVar12 = 0xc2;
      goto LAB_0010bc56;
    }
  }
  else if (((uVar14 != 0xe2) && (uVar14 < 0xe)) && ((0x2401U >> (uVar14 & 0x1f) & 1) != 0))
  goto LAB_0010bbb7;
  (parser->mark).index = (parser->mark).index + 1;
  psVar1 = &(parser->mark).column;
  *psVar1 = *psVar1 + 1;
  sVar15 = parser->unread - 1;
  parser->unread = sVar15;
  bVar12 = *pbVar10;
  lVar16 = 1;
  if ((((char)bVar12 < '\0') && (lVar16 = 2, (bVar12 & 0xe0) != 0xc0)) &&
     (lVar16 = 3, (bVar12 & 0xf0) != 0xe0)) {
    lVar16 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
  }
  pbVar10 = pbVar10 + lVar16;
  (parser->buffer).pointer = pbVar10;
  if (sVar15 == 0) {
    iVar7 = yaml_parser_update_buffer(parser,1);
    if (iVar7 == 0) goto LAB_0010c407;
    pbVar10 = (parser->buffer).pointer;
  }
  uVar14 = (uint)*pbVar10;
  goto LAB_0010bae7;
LAB_0010c033:
  if ((parser->unread < 2) && (iVar7 = yaml_parser_update_buffer(parser,2), iVar7 == 0))
  goto LAB_0010c407;
  if ((pauStack_130 <= *local_128[0] + 5) &&
     (iVar7 = yaml_string_extend((yaml_char_t **)local_138,(yaml_char_t **)local_128,
                                 (yaml_char_t **)(local_138 + 8)), iVar7 == 0)) goto LAB_0010c401;
  pyVar5 = (parser->buffer).pointer;
  yVar4 = *pyVar5;
  if (yVar4 == 0xe2) goto LAB_0010c21b;
  if (yVar4 == '\r') {
    if (pyVar5[1] != '\n') {
LAB_0010c12a:
      (*local_128[0])[0] = 10;
      ppyVar2 = &(parser->buffer).pointer;
      *ppyVar2 = *ppyVar2 + 1;
      goto LAB_0010c1e5;
    }
    (*local_128[0])[0] = 10;
    ppyVar2 = &(parser->buffer).pointer;
    *ppyVar2 = *ppyVar2 + 2;
    lVar16 = 2;
    lStackY_160 = -2;
  }
  else {
    if (yVar4 != 0xc2) {
      if (yVar4 != '\n') goto LAB_0010c21b;
      goto LAB_0010c12a;
    }
    if (pyVar5[1] != 0x85) goto LAB_0010c21b;
    (*local_128[0])[0] = 10;
    ppyVar2 = &(parser->buffer).pointer;
    *ppyVar2 = *ppyVar2 + 2;
LAB_0010c1e5:
    lStackY_160 = -1;
    lVar16 = 1;
  }
  local_128[0] = (undefined1 (*) [16])(*local_128[0] + 1);
  (parser->mark).column = 0;
  (parser->mark).index = lVar16 + (parser->mark).index;
  (parser->mark).line = (parser->mark).line + 1;
  parser->unread = parser->unread + lStackY_160;
LAB_0010c21b:
  start_mark_01.line = start_mark.line;
  start_mark_01.index = start_mark.index;
  start_mark_01.column = start_mark.column;
  iVar7 = yaml_parser_scan_block_scalar_breaks(parser,&local_fc,&local_f8,start_mark_01,&end_mark);
  if (iVar7 == 0) goto LAB_0010c407;
  goto LAB_0010bdd8;
LAB_0010bbb7:
  bVar12 = (byte)uVar14;
  if (bVar12 != 0) {
    if (((uVar14 != 10) && (uVar14 != 0xd)) &&
       ((uVar14 == 0xe2 || ((uVar14 != 0xc2 || (bVar12 = 0xc2, pbVar10[1] != 0x85)))))) {
      parser->error = YAML_SCANNER_ERROR;
      parser->context = "while scanning a block scalar";
      (parser->context_mark).index = start_mark.index;
      (parser->context_mark).line = start_mark.line;
      (parser->context_mark).column = start_mark.column;
      pcVar11 = "did not find expected comment or line break";
LAB_0010bc32:
      parser->problem = pcVar11;
      sVar15 = local_d0->line;
      (parser->problem_mark).index = local_d0->index;
      (parser->problem_mark).line = sVar15;
      (parser->problem_mark).column = local_d0->column;
      goto LAB_0010c407;
    }
LAB_0010bc56:
    if (parser->unread < 2) {
      iVar7 = yaml_parser_update_buffer(parser,2);
      if (iVar7 == 0) goto LAB_0010c407;
      pbVar10 = (parser->buffer).pointer;
      bVar12 = *pbVar10;
    }
    if (bVar12 == 10) {
LAB_0010bce7:
      (parser->mark).column = 0;
      auVar21._8_4_ = 0xffffffff;
      auVar21._0_8_ = 0xffffffffffffffff;
      auVar21._12_4_ = 0xffffffff;
      (parser->mark).index = (parser->mark).index + 1;
      (parser->mark).line = (parser->mark).line - auVar21._8_8_;
      parser->unread = parser->unread - 1;
      bVar12 = *pbVar10;
      if ((char)bVar12 < '\0') {
        if ((bVar12 & 0xe0) == 0xc0) {
LAB_0010bd2a:
          lStackY_160 = 2;
        }
        else if ((bVar12 & 0xf0) == 0xe0) {
          lStackY_160 = 3;
        }
        else {
          lStackY_160 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
        }
      }
      else {
        lStackY_160 = 1;
      }
      (parser->buffer).pointer = pbVar10 + lStackY_160;
    }
    else if (bVar12 != 0xe2) {
      if (bVar12 == 0xc2) {
        if (pbVar10[1] == 0x85) goto LAB_0010bce7;
      }
      else if (bVar12 == 0xd) {
        if (pbVar10[1] != 10) goto LAB_0010bce7;
        (parser->mark).column = 0;
        (parser->mark).index = (parser->mark).index + 2;
        (parser->mark).line = (parser->mark).line + 1;
        parser->unread = parser->unread - 2;
        goto LAB_0010bd2a;
      }
    }
  }
  end_mark.column = local_d0->column;
  end_mark.index = local_d0->index;
  end_mark.line = local_d0->line;
  if (iVar13 != 0) {
    local_fc = 0;
    if (0 < parser->indent) {
      local_fc = parser->indent;
    }
    local_fc = local_fc + iVar13;
  }
  start_mark_00.line = start_mark.line;
  start_mark_00.index = start_mark.index;
  start_mark_00.column = start_mark.column;
  iVar7 = yaml_parser_scan_block_scalar_breaks(parser,&local_fc,&local_f8,start_mark_00,&end_mark);
  if ((iVar7 != 0) &&
     ((parser->unread != 0 || (iVar7 = yaml_parser_update_buffer(parser,1), iVar7 != 0)))) {
    bVar19 = false;
LAB_0010bdd8:
    iVar13 = local_d4;
    iVar7 = local_100;
    if (local_fc == (int)(parser->mark).column) {
      yVar4 = *(parser->buffer).pointer;
      bVar12 = 1;
      if ((yVar4 != '\t') && (yVar4 != ' ')) {
        if (yVar4 == '\0') goto LAB_0010c275;
        bVar12 = 0;
      }
      if ((local_d4 != 0) || ((bool)(bVar12 | bVar19) || *(undefined1 *)local_138 != '\n')) {
        iVar7 = yaml_string_join((yaml_char_t **)&local_118,(yaml_char_t **)&pauStack_108,
                                 (yaml_char_t **)&pauStack_110,(yaml_char_t **)local_138,
                                 (yaml_char_t **)local_128,(yaml_char_t **)(local_138 + 8));
        if (iVar7 == 0) goto LAB_0010c401;
LAB_0010be53:
      }
      else if (*local_f8.start == '\0') {
        if (((undefined1 (*) [16])(*pauStack_108 + 5) < pauStack_110) ||
           (iVar7 = yaml_string_extend((yaml_char_t **)&local_118,(yaml_char_t **)&pauStack_108,
                                       (yaml_char_t **)&pauStack_110), iVar7 != 0)) {
          (*pauStack_108)[0] = 0x20;
          pauStack_108 = (undefined1 (*) [16])(*pauStack_108 + 1);
          goto LAB_0010be53;
        }
        goto LAB_0010c401;
      }
      local_128[0] = (undefined1 (*) [16])local_138;
      memset((void *)local_138,0,(long)pauStack_130 - (long)local_138);
      iVar7 = yaml_string_join((yaml_char_t **)&local_118,(yaml_char_t **)&pauStack_108,
                               (yaml_char_t **)&pauStack_110,&local_f8.start,
                               (yaml_char_t **)((long)&local_f8 + 0x10),
                               (yaml_char_t **)((long)&local_f8 + 8));
      if (iVar7 != 0) {
        local_f8.pointer = local_f8.start;
        memset(local_f8.start,0,(long)local_f8.end - (long)local_f8.start);
        pbVar10 = (parser->buffer).pointer;
        bVar12 = *pbVar10;
        bVar19 = bVar12 == 9 || bVar12 == 0x20;
        do {
          if (bVar12 == 0xc2) {
            if (pbVar10[1] == 0x85) goto LAB_0010c033;
          }
          else if (((bVar12 != 0xe2) && (bVar12 < 0xe)) && ((0x2401U >> (bVar12 & 0x1f) & 1) != 0))
          goto LAB_0010c033;
          if (pauStack_110 <= (undefined1 (*) [16])(*pauStack_108 + 5)) {
            iVar7 = yaml_string_extend((yaml_char_t **)&local_118,(yaml_char_t **)&pauStack_108,
                                       (yaml_char_t **)&pauStack_110);
            if (iVar7 == 0) break;
            pbVar10 = (parser->buffer).pointer;
            bVar12 = *pbVar10;
          }
          if ((char)bVar12 < '\0') {
            if ((bVar12 & 0xe0) == 0xc0) {
LAB_0010bfba:
              (parser->buffer).pointer = pbVar10 + 1;
              (*pauStack_108)[0] = *pbVar10;
              pbVar10 = (parser->buffer).pointer;
              pauStack_108 = (undefined1 (*) [16])(*pauStack_108 + 1);
              goto LAB_0010bfde;
            }
            if ((bVar12 & 0xf0) == 0xe0) {
LAB_0010bf96:
              (parser->buffer).pointer = pbVar10 + 1;
              (*pauStack_108)[0] = *pbVar10;
              pbVar10 = (parser->buffer).pointer;
              pauStack_108 = (undefined1 (*) [16])(*pauStack_108 + 1);
              goto LAB_0010bfba;
            }
            if ((bVar12 & 0xf8) == 0xf0) {
              (parser->buffer).pointer = pbVar10 + 1;
              (*pauStack_108)[0] = *pbVar10;
              pbVar10 = (parser->buffer).pointer;
              pauStack_108 = (undefined1 (*) [16])(*pauStack_108 + 1);
              goto LAB_0010bf96;
            }
          }
          else {
LAB_0010bfde:
            (parser->buffer).pointer = pbVar10 + 1;
            (*pauStack_108)[0] = *pbVar10;
            pauStack_108 = (undefined1 (*) [16])(*pauStack_108 + 1);
          }
          (parser->mark).index = (parser->mark).index + 1;
          psVar1 = &(parser->mark).column;
          *psVar1 = *psVar1 + 1;
          psVar1 = &parser->unread;
          *psVar1 = *psVar1 - 1;
          if ((*psVar1 == 0) && (iVar7 = yaml_parser_update_buffer(parser,1), iVar7 == 0))
          goto LAB_0010c407;
          pbVar10 = (parser->buffer).pointer;
          bVar12 = *pbVar10;
        } while( true );
      }
      goto LAB_0010c401;
    }
LAB_0010c275:
    if (local_100 != -1) {
      iVar8 = yaml_string_join((yaml_char_t **)&local_118,(yaml_char_t **)&pauStack_108,
                               (yaml_char_t **)&pauStack_110,(yaml_char_t **)local_138,
                               (yaml_char_t **)local_128,(yaml_char_t **)(local_138 + 8));
      if (iVar8 == 0) goto LAB_0010c401;
      local_128[0] = (undefined1 (*) [16])local_138;
      if (iVar7 == 1) {
        iVar7 = yaml_string_join((yaml_char_t **)&local_118,(yaml_char_t **)&pauStack_108,
                                 (yaml_char_t **)&pauStack_110,&local_f8.start,
                                 (yaml_char_t **)((long)&local_f8 + 0x10),
                                 (yaml_char_t **)((long)&local_f8 + 8));
        if (iVar7 == 0) goto LAB_0010c401;
        local_f8.pointer = local_f8.start;
      }
    }
    token._4_12_ = SUB1612((undefined1  [16])0x0,4);
    token.type = YAML_SCALAR_TOKEN;
    token.start_mark.index = start_mark.index;
    token.start_mark.line = start_mark.line;
    token.start_mark.column = start_mark.column;
    token.end_mark.index = end_mark.index;
    token.end_mark.line = end_mark.line;
    token.end_mark.column = end_mark.column;
    token.data.tag.handle = (yaml_char_t *)local_118;
    token.data.scalar.style = (iVar13 == 0) + 4;
    token.data.tag.suffix = (yaml_char_t *)((long)pauStack_108 - (long)local_118);
    token.data._20_4_ = 0;
    yaml_free((void *)local_138);
    _local_138 = ZEXT816(0);
    local_128[0] = (undefined1 (*) [16])0x0;
    yaml_free(local_f8.start);
    tail = &(parser->tokens).tail;
    pyVar18 = (parser->tokens).tail;
    if (pyVar18 == (parser->tokens).end) {
      iVar7 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,tail,
                                &(parser->tokens).end);
      if (iVar7 == 0) {
        parser->error = YAML_MEMORY_ERROR;
        yaml_token_delete(&token);
        return 0;
      }
      pyVar18 = *tail;
    }
    *tail = pyVar18 + 1;
    pyVar17 = &token;
    for (lVar16 = 10; lVar16 != 0; lVar16 = lVar16 + -1) {
      uVar6 = *(undefined4 *)&pyVar17->field_0x4;
      pyVar18->type = pyVar17->type;
      *(undefined4 *)&pyVar18->field_0x4 = uVar6;
      pyVar17 = (yaml_token_t *)((long)pyVar17 + (ulong)bVar20 * -0x10 + 8);
      pyVar18 = (yaml_token_t *)((long)pyVar18 + (ulong)bVar20 * -0x10 + 8);
    }
    return 1;
  }
LAB_0010c407:
  yaml_free(local_118);
  local_118 = (undefined1 (*) [16])0x0;
  pauStack_110 = (undefined1 (*) [16])0x0;
  pauStack_108 = (undefined1 (*) [16])0x0;
  yaml_free((void *)local_138);
  _local_138 = (undefined1  [16])0x0;
  local_128[0] = (undefined1 (*) [16])0x0;
  yaml_free(local_f8.start);
  return 0;
}

Assistant:

static int
yaml_parser_fetch_block_scalar(yaml_parser_t *parser, int literal)
{
    yaml_token_t token;

    /* Remove any potential simple keys. */

    if (!yaml_parser_remove_simple_key(parser))
        return 0;

    /* A simple key may follow a block scalar. */

    parser->simple_key_allowed = 1;

    /* Create the SCALAR token and append it to the queue. */

    if (!yaml_parser_scan_block_scalar(parser, &token, literal))
        return 0;

    if (!ENQUEUE(parser, parser->tokens, token)) {
        yaml_token_delete(&token);
        return 0;
    }

    return 1;
}